

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiSettingsHandler * ImGui::FindSettingsHandler(char *type_name)

{
  ImU32 IVar1;
  ImGuiSettingsHandler *pIVar2;
  ImVector<ImGuiSettingsHandler> *this;
  int i;
  
  this = &GImGui->SettingsHandlers;
  i = 0;
  IVar1 = ImHashStr(type_name,0,0);
  while( true ) {
    if (this->Size <= i) {
      return (ImGuiSettingsHandler *)0x0;
    }
    pIVar2 = ImVector<ImGuiSettingsHandler>::operator[](this,i);
    if (pIVar2->TypeHash == IVar1) break;
    i = i + 1;
  }
  pIVar2 = ImVector<ImGuiSettingsHandler>::operator[](this,i);
  return pIVar2;
}

Assistant:

ImGuiSettingsHandler* ImGui::FindSettingsHandler(const char* type_name)
{
    ImGuiContext& g = *GImGui;
    const ImGuiID type_hash = ImHashStr(type_name);
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].TypeHash == type_hash)
            return &g.SettingsHandlers[handler_n];
    return NULL;
}